

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.h
# Opt level: O0

iterator __thiscall
cmList::insert(cmList *this,const_iterator pos,string_view value,ExpandElements expandElements,
              EmptyElements emptyElements)

{
  iterator iVar1;
  allocator<char> local_61;
  string local_60;
  const_iterator local_40;
  EmptyElements local_38;
  ExpandElements local_34;
  EmptyElements emptyElements_local;
  ExpandElements expandElements_local;
  cmList *this_local;
  string_view value_local;
  const_iterator pos_local;
  
  value_local._M_len = (size_t)value._M_str;
  this_local = (cmList *)value._M_len;
  local_40._M_current = pos._M_current;
  local_38 = emptyElements;
  local_34 = expandElements;
  _emptyElements_local = this;
  value_local._M_str = (char *)pos._M_current;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_60,(basic_string_view<char,_std::char_traits<char>_> *)&this_local,
             &local_61);
  iVar1 = Insert(&this->Values,local_40,&local_60,local_34,local_38);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  return (iterator)iVar1._M_current;
}

Assistant:

iterator insert(const_iterator pos, cm::string_view value,
                  ExpandElements expandElements = ExpandElements::Yes,
                  EmptyElements emptyElements = EmptyElements::No)
  {
    return cmList::Insert(this->Values, pos, std::string(value),
                          expandElements, emptyElements);
  }